

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

golf_lightmap_section_t * golf_entity_get_lightmap_section(golf_entity_t *entity)

{
  golf_entity_t *entity_local;
  
  switch(entity->type) {
  case MODEL_ENTITY:
    entity_local = (golf_entity_t *)&(entity->field_4).model.lightmap_section;
    break;
  case BALL_START_ENTITY:
  case HOLE_ENTITY:
  case GROUP_ENTITY:
  case BEGIN_ANIMATION_ENTITY:
  case CAMERA_ZONE_ENTITY:
    entity_local = (golf_entity_t *)0x0;
    break;
  case GEO_ENTITY:
    entity_local = (golf_entity_t *)&entity->field_4;
    break;
  case WATER_ENTITY:
    entity_local = (golf_entity_t *)&entity->field_4;
    break;
  default:
    entity_local = (golf_entity_t *)0x0;
  }
  return (golf_lightmap_section_t *)entity_local;
}

Assistant:

golf_lightmap_section_t *golf_entity_get_lightmap_section(golf_entity_t *entity) {
    switch (entity->type) {
        case MODEL_ENTITY: {
            return &entity->model.lightmap_section;
        }
        case GEO_ENTITY: {
            return &entity->geo.lightmap_section;
        }
        case WATER_ENTITY: {
            return &entity->water.lightmap_section;
        }
        case HOLE_ENTITY:
        case BALL_START_ENTITY:
        case BEGIN_ANIMATION_ENTITY:
        case CAMERA_ZONE_ENTITY:
        case GROUP_ENTITY: {
            return NULL;
        }
    }
    return NULL;
}